

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_is_standard_regexp(JSContext *ctx,JSValue rx)

{
  JSValue v;
  JSValue op2;
  JSValue val_00;
  JSValue op1;
  int iVar1;
  int64_t in_RSI;
  JSValueUnion in_RDI;
  JSValue JVar2;
  int res;
  JSValue val;
  JSAtom in_stack_0000009c;
  JSContext *in_stack_000000a0;
  undefined1 in_stack_000000a8 [16];
  undefined1 in_stack_000000b8 [16];
  BOOL in_stack_00000140;
  JSContext *in_stack_ffffffffffffff50;
  JSValueUnion in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  BOOL local_60;
  JSValueUnion local_40;
  JSValueUnion local_38;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2 = JS_GetPropertyInternal
                    (in_stack_000000a0,(JSValue)in_stack_000000b8,in_stack_0000009c,
                     (JSValue)in_stack_000000a8,in_stack_00000140);
  local_10 = JVar2.u;
  local_8 = JVar2.tag;
  JVar3 = local_10;
  iVar1 = JS_IsException(JVar2);
  if (iVar1 == 0) {
    op1.tag = in_RSI;
    op1.u.ptr = in_RDI.ptr;
    op2.tag = local_8;
    op2.u.ptr = JVar3.ptr;
    local_60 = js_same_value((JSContext *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),op1,op2);
    JVar2.tag = (int64_t)local_10.ptr;
    JVar2.u.float64 = in_stack_ffffffffffffff58.float64;
    JS_FreeValue(in_stack_ffffffffffffff50,JVar2);
    if (local_60 != 0) {
      JVar2 = JS_GetPropertyInternal
                        (in_stack_000000a0,(JSValue)in_stack_000000b8,in_stack_0000009c,
                         (JSValue)in_stack_000000a8,in_stack_00000140);
      local_40 = JVar2.u;
      local_38 = (JSValueUnion)JVar2.tag;
      JVar3 = local_40;
      JVar4 = local_38;
      iVar1 = JS_IsException(JVar2);
      if (iVar1 == 0) {
        val_00.tag = (int64_t)JVar4.ptr;
        val_00.u.ptr = JVar3.ptr;
        local_60 = JS_IsCFunction((JSContext *)in_RDI.ptr,val_00,js_regexp_exec,0);
        v.tag = (int64_t)local_10.ptr;
        v.u.ptr = local_38.ptr;
        JS_FreeValue((JSContext *)local_40.ptr,v);
      }
      else {
        local_60 = -1;
      }
    }
  }
  else {
    local_60 = -1;
  }
  return local_60;
}

Assistant:

static int js_is_standard_regexp(JSContext *ctx, JSValueConst rx)
{
    JSValue val;
    int res;

    val = JS_GetProperty(ctx, rx, JS_ATOM_constructor);
    if (JS_IsException(val))
        return -1;
    // rx.constructor === RegExp
    res = js_same_value(ctx, val, ctx->regexp_ctor);
    JS_FreeValue(ctx, val);
    if (res) {
        val = JS_GetProperty(ctx, rx, JS_ATOM_exec);
        if (JS_IsException(val))
            return -1;
        // rx.exec === RE_exec
        res = JS_IsCFunction(ctx, val, js_regexp_exec, 0);
        JS_FreeValue(ctx, val);
    }
    return res;
}